

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O2

unique_ptr<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_> __thiscall
supermap::io::RamFileManager::getOutputStream(RamFileManager *this,path *filename,bool append)

{
  difference_type __n;
  reference pFVar1;
  undefined7 in_register_00000011;
  path *path;
  allocator<char> local_89;
  undefined1 local_88 [72];
  const_iterator local_40;
  
  path = (path *)CONCAT71(in_register_00000011,append);
  getFileIteratorNoThrow(&local_40,(RamFileManager *)filename,path);
  if (local_40._M_cur == (_Elt_pointer)filename[1]._M_pathname.field_2._M_allocated_capacity) {
    std::__cxx11::string::string((string *)local_88,(string *)path);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_88 + 0x20),"",&local_89);
    std::
    deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
    emplace_back<supermap::io::RamFileManager::File>
              ((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
                *)&(filename->_M_pathname)._M_string_length,(File *)local_88);
    File::~File((File *)local_88);
  }
  getFileIterator(&local_40,(RamFileManager *)filename,path);
  local_88._0_8_ = *(undefined8 *)((long)&(filename->_M_pathname).field_2 + 8);
  local_88._8_8_ = *(undefined8 *)&filename->_M_cmpts;
  local_88._16_8_ = filename[1]._M_pathname._M_dataplus._M_p;
  local_88._24_8_ = filename[1]._M_pathname._M_string_length;
  __n = std::operator-(&local_40,
                       (_Deque_iterator<supermap::io::RamFileManager::File,_supermap::io::RamFileManager::File_&,_supermap::io::RamFileManager::File_*>
                        *)local_88);
  pFVar1 = std::
           _Deque_iterator<supermap::io::RamFileManager::File,_supermap::io::RamFileManager::File_&,_supermap::io::RamFileManager::File_*>
           ::operator[]((_Deque_iterator<supermap::io::RamFileManager::File,_supermap::io::RamFileManager::File_&,_supermap::io::RamFileManager::File_*>
                         *)((long)&(filename->_M_pathname).field_2 + 8),__n);
  std::make_unique<supermap::io::StringOutputStream,std::__cxx11::string&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (bool *)&pFVar1->content);
  (this->super_FileManager)._vptr_FileManager = (_func_int **)local_88._0_8_;
  return (__uniq_ptr_data<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>,_true,_true>
          )(__uniq_ptr_data<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<OutputStream> RamFileManager::getOutputStream(const std::filesystem::path &filename, bool append) {
    auto fileIt = getFileIteratorNoThrow(filename);
    if (fileIt == files.end()) {
        files.push_back({filename, ""});
    }
    fileIt = getFileIterator(filename);
    std::size_t fileIndex = fileIt - files.begin();
    return std::make_unique<StringOutputStream>(files[fileIndex].content, append);
}